

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

ChainstateRole __thiscall Chainstate::GetRole(Chainstate *this)

{
  ChainstateRole CVar1;
  Chainstate *pCVar2;
  long in_FS_OFFSET;
  _Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ChainstateManager::GetAll
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_38,this->m_chainman);
  std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base(&local_38);
  CVar1 = NORMAL;
  if (8 < (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_38._M_impl.super__Vector_impl_data._M_start)) {
    pCVar2 = ChainstateManager::ActiveChainstate(this->m_chainman);
    CVar1 = (pCVar2 == this) + BACKGROUND;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return CVar1;
  }
  __stack_chk_fail();
}

Assistant:

ChainstateRole Chainstate::GetRole() const
{
    if (m_chainman.GetAll().size() <= 1) {
        return ChainstateRole::NORMAL;
    }
    return (this != &m_chainman.ActiveChainstate()) ?
               ChainstateRole::BACKGROUND :
               ChainstateRole::ASSUMEDVALID;
}